

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O3

size_t __thiscall Lodtalk::MethodAssembler::Assembler::addLiteral(Assembler *this,Oop newLiteral)

{
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar2;
  size_t sVar3;
  size_t sVar4;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  VMContext *local_30;
  
  paVar2 = (anon_union_8_4_0eb573b0_for_Oop_0 *)
           (this->literals).super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>.
           _M_impl.super__Vector_impl_data._M_start;
  paVar1 = (anon_union_8_4_0eb573b0_for_Oop_0 *)
           (this->literals).super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar4 = (long)paVar1 - (long)paVar2 >> 5;
  if (paVar1 != paVar2) {
    sVar3 = 0;
    do {
      if ((anon_union_8_4_0eb573b0_for_Oop_0)paVar2->pointer == newLiteral.field_0) {
        return sVar3;
      }
      sVar3 = sVar3 + 1;
      paVar2 = paVar2 + 4;
    } while (sVar4 + (sVar4 == 0) != sVar3);
  }
  local_38 = newLiteral.field_0;
  local_30 = getCurrentContext();
  OopRef::registerSelf((OopRef *)&local_38);
  std::vector<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>::emplace_back<Lodtalk::OopRef>
            (&this->literals,(OopRef *)&local_38);
  OopRef::unregisterSelf((OopRef *)&local_38);
  return sVar4;
}

Assistant:

size_t Assembler::addLiteral(Oop newLiteral)
{
	for (size_t i = 0; i < literals.size(); ++i)
	{
		if(literals[i] == newLiteral)
			return i;
	}

	auto ret = literals.size();
	literals.push_back(newLiteral);
	return ret;
}